

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t2.c
# Opt level: O1

OPJ_BOOL opj_t2_encode_packets
                   (opj_t2_t *p_t2,OPJ_UINT32 p_tile_no,opj_tcd_tile_t *p_tile,
                   OPJ_UINT32 p_maxlayers,OPJ_BYTE *p_dest,OPJ_UINT32 *p_data_written,
                   OPJ_UINT32 p_max_len,opj_codestream_info_t *cstr_info,OPJ_UINT32 p_tp_num,
                   OPJ_INT32 p_tp_pos,OPJ_UINT32 p_pino,J2K_T2_MODE p_t2_mode,
                   opj_event_mgr_t *p_manager)

{
  uint uVar1;
  bool bVar2;
  int iVar3;
  opj_pi_iterator_t *poVar4;
  OPJ_UINT32 OVar5;
  opj_packet_info_t *poVar6;
  long lVar7;
  OPJ_BOOL OVar8;
  opj_pi_iterator_t *pi;
  uint uVar9;
  OPJ_BYTE *dest;
  bool bVar10;
  OPJ_UINT32 l_nb_bytes;
  OPJ_UINT32 local_80;
  OPJ_UINT32 local_7c;
  opj_pi_iterator_t *local_78;
  OPJ_UINT32 local_6c;
  OPJ_UINT32 local_68;
  OPJ_UINT16 local_62;
  opj_cp_t *local_60;
  uint local_54;
  opj_tcp_t *local_50;
  OPJ_BYTE *local_48;
  OPJ_UINT32 *local_40;
  opj_tcd_tile_t *local_38;
  
  l_nb_bytes = 0;
  local_60 = p_t2->cp;
  local_50 = local_60->tcps + p_tile_no;
  if ((local_60->m_specific_param).m_dec.m_reduce == 0) {
    local_6c = 1;
  }
  else {
    local_6c = p_t2->image->numcomps;
  }
  local_62 = local_60->rsiz;
  OVar5 = local_50->numpocs;
  local_80 = p_tile_no;
  local_54 = p_maxlayers;
  local_40 = p_data_written;
  local_38 = p_tile;
  poVar4 = opj_pi_initialise_encode(p_t2->image,local_60,p_tile_no,p_t2_mode);
  if (poVar4 == (opj_pi_iterator_t *)0x0) {
LAB_00134f38:
    OVar8 = 0;
  }
  else {
    local_7c = OVar5 + 1;
    *local_40 = 0;
    local_78 = poVar4;
    if (p_t2_mode == THRESH_CALC) {
      OVar8 = 1;
      if (local_6c != 0) {
        local_68 = 0;
        pi = poVar4;
        local_48 = p_dest;
        do {
          bVar10 = true;
          uVar9 = 0;
          OVar5 = 0;
          poVar4 = pi;
          do {
            opj_pi_create_encode(poVar4,local_60,local_80,OVar5,local_68,p_tp_pos,THRESH_CALC);
            if ((pi->poc).prg == OPJ_PROG_UNKNOWN) {
              opj_pi_destroy(poVar4,local_7c);
              bVar2 = false;
            }
            else {
              iVar3 = opj_pi_next(pi);
              poVar4 = local_78;
              dest = local_48;
              while (local_78 = poVar4, iVar3 != 0) {
                if (pi->layno < local_54) {
                  l_nb_bytes = 0;
                  OVar8 = opj_t2_encode_packet
                                    (local_80,local_38,local_50,pi,dest,&l_nb_bytes,p_max_len,
                                     cstr_info,THRESH_CALC,p_manager);
                  if (OVar8 == 0) goto LAB_00134ed1;
                  uVar9 = uVar9 + l_nb_bytes;
                  dest = dest + l_nb_bytes;
                  p_max_len = p_max_len - l_nb_bytes;
                  *local_40 = *local_40 + l_nb_bytes;
                }
                iVar3 = opj_pi_next(pi);
                poVar4 = local_78;
              }
              uVar1 = (local_60->m_specific_param).m_dec.m_reduce;
              if ((uVar1 == 0) || (uVar9 <= uVar1)) {
                pi = pi + 1;
                bVar2 = true;
                local_48 = dest;
              }
              else {
LAB_00134ed1:
                poVar4 = local_78;
                local_48 = dest;
                opj_pi_destroy(local_78,local_7c);
                bVar2 = false;
              }
            }
            if (!bVar2) break;
            bVar10 = OVar5 == 0;
            OVar5 = OVar5 + 1;
            bVar10 = bVar10 && local_62 == 4;
          } while (bVar10);
          if (bVar10) goto LAB_00134f38;
          local_68 = local_68 + 1;
          pi = poVar4;
        } while (local_68 != local_6c);
        OVar8 = 1;
      }
    }
    else {
      opj_pi_create_encode(poVar4,local_60,local_80,p_pino,p_tp_num,p_tp_pos,p_t2_mode);
      OVar8 = 0;
      poVar4 = local_78;
      if (local_78[p_pino].poc.prg != OPJ_PROG_UNKNOWN) {
        poVar4 = local_78 + p_pino;
        iVar3 = opj_pi_next(poVar4);
        while (iVar3 != 0) {
          if (poVar4->layno < local_54) {
            l_nb_bytes = 0;
            OVar8 = opj_t2_encode_packet
                              (local_80,local_38,local_50,poVar4,p_dest,&l_nb_bytes,p_max_len,
                               cstr_info,p_t2_mode,p_manager);
            if (OVar8 == 0) {
              OVar8 = 0;
              poVar4 = local_78;
              goto LAB_00134f43;
            }
            *local_40 = *local_40 + l_nb_bytes;
            if (cstr_info != (opj_codestream_info_t *)0x0) {
              if (cstr_info->index_write != 0) {
                poVar6 = cstr_info->tile[p_tile_no].packet + cstr_info->packno;
                if ((long)cstr_info->packno == 0) {
                  lVar7 = (long)cstr_info->tile[p_tile_no].end_header;
LAB_00134d74:
                  lVar7 = lVar7 + 1;
                }
                else if (((((byte)local_50->field_0x1638 >> 2 |
                           *(byte *)((long)&local_60->m_specific_param + 0x11) >> 3) & 1) == 0) ||
                        (lVar7 = poVar6->start_pos, lVar7 == 0)) {
                  lVar7 = poVar6[-1].end_pos;
                  goto LAB_00134d74;
                }
                poVar6->start_pos = lVar7;
                poVar6->end_pos = (ulong)l_nb_bytes + lVar7 + -1;
                poVar6->end_ph_pos = lVar7 + poVar6->end_ph_pos + -1;
              }
              cstr_info->packno = cstr_info->packno + 1;
            }
            p_dest = p_dest + l_nb_bytes;
            p_max_len = p_max_len - l_nb_bytes;
            local_38->packno = local_38->packno + 1;
          }
          iVar3 = opj_pi_next(poVar4);
        }
        OVar8 = 1;
        poVar4 = local_78;
      }
    }
LAB_00134f43:
    opj_pi_destroy(poVar4,local_7c);
  }
  return OVar8;
}

Assistant:

OPJ_BOOL opj_t2_encode_packets(opj_t2_t* p_t2,
                               OPJ_UINT32 p_tile_no,
                               opj_tcd_tile_t *p_tile,
                               OPJ_UINT32 p_maxlayers,
                               OPJ_BYTE *p_dest,
                               OPJ_UINT32 * p_data_written,
                               OPJ_UINT32 p_max_len,
                               opj_codestream_info_t *cstr_info,
                               OPJ_UINT32 p_tp_num,
                               OPJ_INT32 p_tp_pos,
                               OPJ_UINT32 p_pino,
                               J2K_T2_MODE p_t2_mode,
                               opj_event_mgr_t *p_manager)
{
    OPJ_BYTE *l_current_data = p_dest;
    OPJ_UINT32 l_nb_bytes = 0;
    OPJ_UINT32 compno;
    OPJ_UINT32 poc;
    opj_pi_iterator_t *l_pi = 00;
    opj_pi_iterator_t *l_current_pi = 00;
    opj_image_t *l_image = p_t2->image;
    opj_cp_t *l_cp = p_t2->cp;
    opj_tcp_t *l_tcp = &l_cp->tcps[p_tile_no];
    OPJ_UINT32 pocno = (l_cp->rsiz == OPJ_PROFILE_CINEMA_4K) ? 2 : 1;
    OPJ_UINT32 l_max_comp = l_cp->m_specific_param.m_enc.m_max_comp_size > 0 ?
                            l_image->numcomps : 1;
    OPJ_UINT32 l_nb_pocs = l_tcp->numpocs + 1;

    l_pi = opj_pi_initialise_encode(l_image, l_cp, p_tile_no, p_t2_mode);
    if (!l_pi) {
        return OPJ_FALSE;
    }

    * p_data_written = 0;

    if (p_t2_mode == THRESH_CALC) { /* Calculating threshold */
        l_current_pi = l_pi;

        for (compno = 0; compno < l_max_comp; ++compno) {
            OPJ_UINT32 l_comp_len = 0;
            l_current_pi = l_pi;

            for (poc = 0; poc < pocno ; ++poc) {
                OPJ_UINT32 l_tp_num = compno;

                /* TODO MSD : check why this function cannot fail (cf. v1) */
                opj_pi_create_encode(l_pi, l_cp, p_tile_no, poc, l_tp_num, p_tp_pos, p_t2_mode);

                if (l_current_pi->poc.prg == OPJ_PROG_UNKNOWN) {
                    /* TODO ADE : add an error */
                    opj_pi_destroy(l_pi, l_nb_pocs);
                    return OPJ_FALSE;
                }
                while (opj_pi_next(l_current_pi)) {
                    if (l_current_pi->layno < p_maxlayers) {
                        l_nb_bytes = 0;

                        if (! opj_t2_encode_packet(p_tile_no, p_tile, l_tcp, l_current_pi,
                                                   l_current_data, &l_nb_bytes,
                                                   p_max_len, cstr_info,
                                                   p_t2_mode,
                                                   p_manager)) {
                            opj_pi_destroy(l_pi, l_nb_pocs);
                            return OPJ_FALSE;
                        }

                        l_comp_len += l_nb_bytes;
                        l_current_data += l_nb_bytes;
                        p_max_len -= l_nb_bytes;

                        * p_data_written += l_nb_bytes;
                    }
                }

                if (l_cp->m_specific_param.m_enc.m_max_comp_size) {
                    if (l_comp_len > l_cp->m_specific_param.m_enc.m_max_comp_size) {
                        opj_pi_destroy(l_pi, l_nb_pocs);
                        return OPJ_FALSE;
                    }
                }

                ++l_current_pi;
            }
        }
    } else { /* t2_mode == FINAL_PASS  */
        opj_pi_create_encode(l_pi, l_cp, p_tile_no, p_pino, p_tp_num, p_tp_pos,
                             p_t2_mode);

        l_current_pi = &l_pi[p_pino];
        if (l_current_pi->poc.prg == OPJ_PROG_UNKNOWN) {
            /* TODO ADE : add an error */
            opj_pi_destroy(l_pi, l_nb_pocs);
            return OPJ_FALSE;
        }
        while (opj_pi_next(l_current_pi)) {
            if (l_current_pi->layno < p_maxlayers) {
                l_nb_bytes = 0;

                if (! opj_t2_encode_packet(p_tile_no, p_tile, l_tcp, l_current_pi,
                                           l_current_data, &l_nb_bytes, p_max_len,
                                           cstr_info, p_t2_mode, p_manager)) {
                    opj_pi_destroy(l_pi, l_nb_pocs);
                    return OPJ_FALSE;
                }

                l_current_data += l_nb_bytes;
                p_max_len -= l_nb_bytes;

                * p_data_written += l_nb_bytes;

                /* INDEX >> */
                if (cstr_info) {
                    if (cstr_info->index_write) {
                        opj_tile_info_t *info_TL = &cstr_info->tile[p_tile_no];
                        opj_packet_info_t *info_PK = &info_TL->packet[cstr_info->packno];
                        if (!cstr_info->packno) {
                            info_PK->start_pos = info_TL->end_header + 1;
                        } else {
                            info_PK->start_pos = ((l_cp->m_specific_param.m_enc.m_tp_on | l_tcp->POC) &&
                                                  info_PK->start_pos) ? info_PK->start_pos : info_TL->packet[cstr_info->packno -
                                                                            1].end_pos + 1;
                        }
                        info_PK->end_pos = info_PK->start_pos + l_nb_bytes - 1;
                        info_PK->end_ph_pos += info_PK->start_pos -
                                               1;  /* End of packet header which now only represents the distance
                                                                                                                                                                                                                                                   to start of packet is incremented by value of start of packet*/
                    }

                    cstr_info->packno++;
                }
                /* << INDEX */
                ++p_tile->packno;
            }
        }
    }

    opj_pi_destroy(l_pi, l_nb_pocs);

    return OPJ_TRUE;
}